

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PDynArray * NewDynArray(PType *type)

{
  PClass *len;
  PDynArray *local_20;
  PType *atype;
  size_t bucket;
  PType *type_local;
  
  len = PDynArray::RegistrationInfo.MyClass;
  bucket = (size_t)type;
  local_20 = (PDynArray *)
             FTypeTable::FindType
                       (&TypeTable,PDynArray::RegistrationInfo.MyClass,(intptr_t)type,0,
                        (size_t *)&atype);
  if (local_20 == (PDynArray *)0x0) {
    local_20 = (PDynArray *)DObject::operator_new((DObject *)0x88,(size_t)len);
    PDynArray::PDynArray(local_20,(PType *)bucket);
    FTypeTable::AddType(&TypeTable,(PType *)local_20,PDynArray::RegistrationInfo.MyClass,bucket,0,
                        (size_t)atype);
  }
  return local_20;
}

Assistant:

PDynArray *NewDynArray(PType *type)
{
	size_t bucket;
	PType *atype = TypeTable.FindType(RUNTIME_CLASS(PDynArray), (intptr_t)type, 0, &bucket);
	if (atype == NULL)
	{
		atype = new PDynArray(type);
		TypeTable.AddType(atype, RUNTIME_CLASS(PDynArray), (intptr_t)type, 0, bucket);
	}
	return (PDynArray *)atype;
}